

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int process_add_entry(archive_read *a,mtree *mtree,mtree_option **global,char *line,ssize_t line_len
                     ,mtree_entry **last_entry,int is_form_d)

{
  int iVar1;
  mtree_entry *mentry;
  int *piVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sStack_78;
  int r;
  size_t len;
  char *end;
  char *name;
  char *eq;
  char *next;
  mtree_option *iter;
  mtree_entry *entry;
  mtree_entry **last_entry_local;
  ssize_t line_len_local;
  char *line_local;
  mtree_option **global_local;
  mtree *mtree_local;
  archive_read *a_local;
  
  mentry = (mtree_entry *)malloc(0x20);
  if (mentry == (mtree_entry *)0x0) {
    piVar2 = __errno_location();
    archive_set_error(&a->archive,*piVar2,"Can\'t allocate memory");
    a_local._4_4_ = -0x1e;
  }
  else {
    mentry->next = (mtree_entry *)0x0;
    mentry->options = (mtree_option *)0x0;
    mentry->name = (char *)0x0;
    mentry->used = '\0';
    mentry->full = '\0';
    if (*last_entry == (mtree_entry *)0x0) {
      mtree->entries = mentry;
    }
    else {
      (*last_entry)->next = mentry;
    }
    *last_entry = mentry;
    if (is_form_d == 0) {
      sStack_78 = strcspn(line," \t\r\n");
      line_len_local = (ssize_t)(line + sStack_78);
      len = line_len_local + line_len;
      end = line;
    }
    else {
      end = line + line_len;
      last_entry_local = (mtree_entry **)line_len;
      while ((end = end + -1, 0 < (long)last_entry_local &&
             ((((*end == '\r' || (*end == '\n')) || (*end == '\t')) || (*end == ' '))))) {
        last_entry_local = (mtree_entry **)((long)last_entry_local + -1);
      }
      sStack_78 = 0;
      for (; 0 < (long)last_entry_local;
          last_entry_local = (mtree_entry **)((long)last_entry_local + -1)) {
        if (((*end == '\r') || (*end == '\n')) || ((*end == '\t' || (*end == ' ')))) {
          end = end + 1;
          break;
        }
        end = end + -1;
        sStack_78 = sStack_78 + 1;
      }
      len = (size_t)end;
      line_len_local = (ssize_t)line;
    }
    pcVar3 = (char *)malloc(sStack_78 + 1);
    mentry->name = pcVar3;
    if (pcVar3 == (char *)0x0) {
      piVar2 = __errno_location();
      archive_set_error(&a->archive,*piVar2,"Can\'t allocate memory");
      a_local._4_4_ = -0x1e;
    }
    else {
      memcpy(mentry->name,end,sStack_78);
      mentry->name[sStack_78] = '\0';
      parse_escapes(mentry->name,mentry);
      for (next = (char *)*global; next != (char *)0x0; next = *(char **)next) {
        pcVar3 = *(char **)(next + 8);
        sVar4 = strlen(*(char **)(next + 8));
        iVar1 = add_option(a,&mentry->options,pcVar3,sVar4);
        if (iVar1 != 0) {
          return iVar1;
        }
      }
      do {
        sVar4 = strspn((char *)line_len_local," \t\r\n");
        pcVar3 = (char *)(line_len_local + sVar4);
        if (*pcVar3 == '\0') {
          return 0;
        }
        if (len <= pcVar3) {
          return 0;
        }
        sVar4 = strcspn(pcVar3," \t\r\n");
        line_len_local = (ssize_t)(pcVar3 + sVar4);
        pcVar5 = strchr(pcVar3,0x3d);
        if ((pcVar5 == (char *)0x0) || ((ulong)line_len_local < pcVar5)) {
          sStack_78 = line_len_local - (long)pcVar3;
        }
        else {
          sStack_78 = (long)pcVar5 - (long)pcVar3;
        }
        remove_option(&mentry->options,pcVar3,sStack_78);
        a_local._4_4_ = add_option(a,&mentry->options,pcVar3,line_len_local - (long)pcVar3);
      } while (a_local._4_4_ == 0);
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
process_add_entry(struct archive_read *a, struct mtree *mtree,
    struct mtree_option **global, const char *line, ssize_t line_len,
    struct mtree_entry **last_entry, int is_form_d)
{
	struct mtree_entry *entry;
	struct mtree_option *iter;
	const char *next, *eq, *name, *end;
	size_t len;
	int r;

	if ((entry = malloc(sizeof(*entry))) == NULL) {
		archive_set_error(&a->archive, errno, "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}
	entry->next = NULL;
	entry->options = NULL;
	entry->name = NULL;
	entry->used = 0;
	entry->full = 0;

	/* Add this entry to list. */
	if (*last_entry == NULL)
		mtree->entries = entry;
	else
		(*last_entry)->next = entry;
	*last_entry = entry;

	if (is_form_d) {
		/*
		 * This form places the file name as last parameter.
		 */
		name = line + line_len -1;
		while (line_len > 0) {
			if (*name != '\r' && *name != '\n' &&
			    *name != '\t' && *name != ' ')
				break;
			name--;
			line_len--;
		}
		len = 0;
		while (line_len > 0) {
			if (*name == '\r' || *name == '\n' ||
			    *name == '\t' || *name == ' ') {
				name++;
				break;
			}
			name--;
			line_len--;
			len++;
		}
		end = name;
	} else {
		len = strcspn(line, " \t\r\n");
		name = line;
		line += len;
		end = line + line_len;
	}

	if ((entry->name = malloc(len + 1)) == NULL) {
		archive_set_error(&a->archive, errno, "Can't allocate memory");
		return (ARCHIVE_FATAL);
	}

	memcpy(entry->name, name, len);
	entry->name[len] = '\0';
	parse_escapes(entry->name, entry);

	for (iter = *global; iter != NULL; iter = iter->next) {
		r = add_option(a, &entry->options, iter->value,
		    strlen(iter->value));
		if (r != ARCHIVE_OK)
			return (r);
	}

	for (;;) {
		next = line + strspn(line, " \t\r\n");
		if (*next == '\0')
			return (ARCHIVE_OK);
		if (next >= end)
			return (ARCHIVE_OK);
		line = next;
		next = line + strcspn(line, " \t\r\n");
		eq = strchr(line, '=');
		if (eq == NULL || eq > next)
			len = next - line;
		else
			len = eq - line;

		remove_option(&entry->options, line, len);
		r = add_option(a, &entry->options, line, next - line);
		if (r != ARCHIVE_OK)
			return (r);
		line = next;
	}
}